

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O3

void __thiscall QFileDialogPrivate::createWidgets(QFileDialogPrivate *this)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  QWidget *this_00;
  QWidgetData *pQVar5;
  void **ppvVar6;
  QSidebar *pQVar7;
  QDialogButtonBox *pQVar8;
  QFileDialogComboBox *pQVar9;
  QFileDialogLineEdit *pQVar10;
  QAbstractItemModel *model;
  QComboBox *pQVar11;
  QFileDialogListView *pQVar12;
  QFileDialogTreeView *pQVar13;
  QSplitter *this_01;
  undefined8 uVar14;
  bool bVar15;
  WindowStates newstate;
  undefined4 uVar16;
  int iVar17;
  int iVar18;
  FileMode mode;
  AcceptMode mode_00;
  ViewMode mode_01;
  Options options;
  QFileSystemModel *pQVar19;
  QPlatformDialogHelper *pQVar20;
  undefined4 *puVar21;
  Ui_QFileDialog *__s;
  QFSCompleter *this_02;
  QShortcut *pQVar22;
  QWidget *pQVar23;
  QActionGroup *this_03;
  QAction *this_04;
  QItemSelectionModel *pQVar24;
  QItemSelectionModel *pQVar25;
  long lVar26;
  Ui_QFileDialog *pUVar27;
  QUrl *url;
  QUrl *url_00;
  QAbstractProxyModel *pQVar28;
  QItemSelectionModel *oldD;
  long in_FS_OFFSET;
  Representation RVar29;
  Representation RVar30;
  QAnyStringView QVar31;
  QByteArrayView QVar32;
  QByteArrayView QVar33;
  QByteArrayView QVar34;
  QByteArrayView QVar35;
  QByteArrayView QVar36;
  QAnyStringView QVar37;
  QUrl local_158;
  undefined1 *puStack_150;
  QObject local_140 [8];
  QObject local_138 [8];
  Connection local_130;
  QObject local_128 [8];
  Connection local_120;
  QObject local_118 [8];
  QObject local_110 [8];
  QObject local_108 [8];
  QObject local_100 [8];
  QObject local_f8 [8];
  QObject local_f0 [8];
  QObject local_e8 [8];
  QObject local_e0 [8];
  QObject local_d8 [8];
  QObject local_d0 [8];
  QObject local_c8 [8];
  QObject local_c0 [8];
  QObject local_b8 [8];
  QFontMetrics fm;
  QString local_a8;
  undefined1 local_88 [16];
  qsizetype local_78;
  QObject local_70 [8];
  QObject local_68 [8];
  QObject local_60 [8];
  undefined1 local_58 [32];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->qFileDialogUi).d != (Ui_QFileDialog *)0x0) goto LAB_004e1679;
  this_00 = *(QWidget **)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  bVar15 = QWidget::testAttribute_helper(this_00,WA_Resized);
  RVar29.m_i = 0xffffffff;
  RVar30.m_i = 0xffffffff;
  if (bVar15) {
    pQVar5 = this_00->data;
    uVar1 = (pQVar5->crect).x2;
    uVar3 = (pQVar5->crect).y2;
    uVar2 = (pQVar5->crect).x1;
    uVar4 = (pQVar5->crect).y1;
    RVar29.m_i = (uVar1 - uVar2) + 1;
    RVar30.m_i = (uVar3 - uVar4) + 1;
  }
  newstate = QWidget::windowState(this_00);
  pQVar19 = (QFileSystemModel *)operator_new(0x10);
  QFileSystemModel::QFileSystemModel(pQVar19,&this_00->super_QObject);
  this->model = pQVar19;
  QFileSystemModel::setIconProvider((QAbstractFileIconProvider *)pQVar19);
  pQVar19 = this->model;
  uVar16 = QFileDialogOptions::filter();
  QFileSystemModel::setFilter(pQVar19,uVar16);
  QVar31.m_size = (size_t)"qt_filesystem_model";
  QVar31.field_0 =
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)
       (anon_union_8_3_8ad491a7_for_QAnyStringView_6)this->model;
  QObject::setObjectName(QVar31);
  pQVar20 = QDialogPrivate::platformHelper(&this->super_QDialogPrivate);
  pQVar19 = this->model;
  if (pQVar20 != (QPlatformDialogHelper *)0x0) {
    (**(code **)(*(long *)pQVar20 + 0x80))(pQVar20);
  }
  QFileSystemModel::setNameFilterDisables(SUB81(pQVar19,0));
  pQVar19 = this->model;
  *(undefined1 *)((long)*(void **)(pQVar19 + 8) + 0x1b4) = 1;
  local_58._0_8_ = QFileSystemModel::fileRenamed;
  local_58._8_8_ = 0;
  local_88._8_8_ = 0;
  local_88._0_8_ = fileRenamed;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QString_&,_const_QString_&,_const_QString_&),_QtPrivate::List<const_QString_&,_const_QString_&,_const_QString_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = fileRenamed;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_60,(void **)pQVar19,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)local_88,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_60);
  pQVar19 = this->model;
  local_58._0_8_ = QFileSystemModel::rootPathChanged;
  local_58._8_8_ = 0;
  local_88._8_8_ = 0;
  local_88._0_8_ = pathChanged;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = pathChanged;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_68,(void **)pQVar19,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)local_88,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_68);
  pQVar19 = this->model;
  local_58._0_8_ = QAbstractItemModel::rowsInserted;
  local_58._8_8_ = (ImplFn)0x0;
  local_88._8_8_ = 0;
  local_88._0_8_ = rowsInserted;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = rowsInserted;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_70,(void **)pQVar19,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)local_88,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_70);
  QFileSystemModel::setReadOnly(SUB81(this->model,0));
  __s = (Ui_QFileDialog *)operator_new(0xd0);
  memset(__s,0,0xd0);
  pUVar27 = (this->qFileDialogUi).d;
  if (pUVar27 != __s) {
    (this->qFileDialogUi).d = __s;
    operator_delete(pUVar27,0xd0);
    pUVar27 = (this->qFileDialogUi).d;
  }
  Ui_QFileDialog::setupUi(pUVar27,(QDialog *)this_00);
  local_88._0_4_ = (QAtomicInteger<int>)0x0;
  local_88._4_4_ = 0;
  local_88._8_8_ = (ImplFn)0x0;
  local_78 = 0;
  QVar32.m_data = (storage_type *)0x5;
  QVar32.m_size = (qsizetype)local_58;
  QString::fromLatin1(QVar32);
  local_a8.d.d = (Data *)local_58._0_8_;
  local_a8.d.ptr = (char16_t *)local_58._8_8_;
  local_a8.d.size = local_58._16_8_;
  QUrl::QUrl(&local_158,(QString *)&local_a8,TolerantMode);
  QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
            ((QMovableArrayOps<QUrl> *)local_88,local_78,&local_158);
  QList<QUrl>::end((QList<QUrl> *)local_88);
  QDir::homePath();
  QUrl::fromLocalFile((QString *)&fm);
  QtPrivate::QMovableArrayOps<QUrl>::emplace<QUrl>
            ((QMovableArrayOps<QUrl> *)local_88,local_78,(QUrl *)&fm);
  QList<QUrl>::end((QList<QUrl> *)local_88);
  QUrl::~QUrl((QUrl *)&fm);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  QUrl::~QUrl(&local_158);
  if ((QSize)local_a8.d.d != (QSize)0x0) {
    LOCK();
    *(int *)local_a8.d.d = *(int *)local_a8.d.d + -1;
    UNLOCK();
    if (*(int *)local_a8.d.d == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QSidebar::setModelAndUrls(((this->qFileDialogUi).d)->sidebar,this->model,(QList<QUrl> *)local_88);
  pQVar7 = ((this->qFileDialogUi).d)->sidebar;
  local_58._0_8_ = QSidebar::goToUrl;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)goToUrl;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QUrl_&),_QtPrivate::List<const_QUrl_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = goToUrl;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_b8,(void **)pQVar7,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_b8);
  pQVar8 = ((this->qFileDialogUi).d)->buttonBox;
  local_a8.d.d = (Data *)0x1b9;
  local_a8.d.ptr = (char16_t *)0x0;
  local_58._0_8_ = QDialogButtonBox::accepted;
  local_58._8_8_ = 0;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::QCallableObject<void_(QFileDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar21 + 4) = 0x1b9;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_c0,(void **)pQVar8,(QObject *)local_58,(void **)this_00,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c0);
  pQVar8 = ((this->qFileDialogUi).d)->buttonBox;
  local_a8.d.d = (Data *)0x1c1;
  local_a8.d.ptr = (char16_t *)0x0;
  local_58._0_8_ = QDialogButtonBox::rejected;
  local_58._8_8_ = 0;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::QCallableObject<void_(QDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar21 + 4) = 0x1c1;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_c8,(void **)pQVar8,(QObject *)local_58,(void **)this_00,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_c8);
  QFileDialogComboBox::setFileDialogPrivate(((this->qFileDialogUi).d)->lookInCombo,this);
  pQVar9 = ((this->qFileDialogUi).d)->lookInCombo;
  local_58._0_8_ = QComboBox::textActivated;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)goToDirectory;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = goToDirectory;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_d0,(void **)pQVar9,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_d0);
  QComboBox::setInsertPolicy(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox,NoInsert);
  QComboBox::setDuplicatesEnabled(&((this->qFileDialogUi).d)->lookInCombo->super_QComboBox,false);
  pUVar27 = (this->qFileDialogUi).d;
  pQVar10 = pUVar27->fileNameEdit;
  pQVar10->d_ptr = this;
  QLabel::setBuddy(pUVar27->fileNameLabel,(QWidget *)pQVar10);
  this_02 = (QFSCompleter *)operator_new(0x20);
  model = (QAbstractItemModel *)this->model;
  QCompleter::QCompleter((QCompleter *)this_02,model,&this_00->super_QObject);
  *(undefined ***)&this_02->super_QCompleter = &PTR_metaObject_00801d60;
  this_02->proxyModel = (QAbstractProxyModel *)0x0;
  this_02->sourceModel = (QFileSystemModel *)model;
  this->completer = this_02;
  QLineEdit::setCompleter
            (&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit,(QCompleter *)this_02);
  QWidget::setInputMethodHints
            ((QWidget *)((this->qFileDialogUi).d)->fileNameEdit,(InputMethodHints)0x40);
  pQVar10 = ((this->qFileDialogUi).d)->fileNameEdit;
  local_58._0_8_ = QLineEdit::textChanged;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)autoCompleteFileName;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = autoCompleteFileName;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_d8,(void **)pQVar10,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_d8);
  pQVar10 = ((this->qFileDialogUi).d)->fileNameEdit;
  local_58._0_8_ = QLineEdit::textChanged;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)updateOkButton;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QFileDialogPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar21 + 4) = updateOkButton;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_e0,(void **)pQVar10,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_e0);
  pQVar10 = ((this->qFileDialogUi).d)->fileNameEdit;
  local_a8.d.d = (Data *)0x1b9;
  local_a8.d.ptr = (char16_t *)0x0;
  local_58._0_8_ = QLineEdit::returnPressed;
  local_58._8_8_ = 0;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::QCallableObject<void_(QFileDialog::*)(),_QtPrivate::List<>,_void>::impl;
  *(undefined8 *)(puVar21 + 4) = 0x1b9;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_e8,(void **)pQVar10,(QObject *)local_58,(void **)this_00,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_e8);
  QComboBox::setDuplicatesEnabled(((this->qFileDialogUi).d)->fileTypeCombo,false);
  QComboBox::setSizeAdjustPolicy
            (((this->qFileDialogUi).d)->fileTypeCombo,AdjustToContentsOnFirstShow);
  QWidget::setSizePolicy
            (&((this->qFileDialogUi).d)->fileTypeCombo->super_QWidget,(QSizePolicy)0x70000);
  pQVar11 = ((this->qFileDialogUi).d)->fileTypeCombo;
  local_58._0_8_ = QComboBox::activated;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)useNameFilter;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QFileDialogPrivate::*)(int),_QtPrivate::List<int>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = useNameFilter;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_f0,(void **)pQVar11,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_f0);
  pQVar11 = ((this->qFileDialogUi).d)->fileTypeCombo;
  local_a8.d.d = (Data *)QFileDialog::filterSelected;
  local_a8.d.ptr = (char16_t *)0x0;
  local_58._0_8_ = QComboBox::textActivated;
  local_58._8_8_ = 0;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QCallableObject<void_(QFileDialog::*)(const_QString_&),_QtPrivate::List<const_QString_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = QFileDialog::filterSelected;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_f8,(void **)pQVar11,(QObject *)local_58,(void **)this_00,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_f8);
  QFileDialogListView::setFileDialogPrivate(((this->qFileDialogUi).d)->listView,this);
  pQVar12 = ((this->qFileDialogUi).d)->listView;
  (**(code **)(*(long *)&(pQVar12->super_QListView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
            (pQVar12,this->model);
  pQVar12 = ((this->qFileDialogUi).d)->listView;
  local_58._0_8_ = QAbstractItemView::activated;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)enterDirectory;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = enterDirectory;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_100,(void **)pQVar12,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_100);
  pQVar12 = ((this->qFileDialogUi).d)->listView;
  local_58._0_8_ = QWidget::customContextMenuRequested;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)showContextMenu;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QPoint_&),_QtPrivate::List<const_QPoint_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = showContextMenu;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_108,(void **)pQVar12,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_108);
  pQVar22 = (QShortcut *)operator_new(0x10);
  QShortcut::QShortcut
            (pQVar22,Delete,(QObject *)((this->qFileDialogUi).d)->listView,(char *)0x0,(char *)0x0,
             WindowShortcut);
  local_58._0_8_ = QShortcut::activated;
  local_58._8_8_ = (ImplFn)0x0;
  local_a8.d.d = (Data *)deleteCurrent;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QFileDialogPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar21 + 4) = deleteCurrent;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_110,(void **)pQVar22,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_110);
  QFileDialogTreeView::setFileDialogPrivate(((this->qFileDialogUi).d)->treeView,this);
  pQVar13 = ((this->qFileDialogUi).d)->treeView;
  (**(code **)(*(long *)&(pQVar13->super_QTreeView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1c8))
            (pQVar13,this->model);
  pQVar23 = (QWidget *)QTreeView::header(&((this->qFileDialogUi).d)->treeView->super_QTreeView);
  _fm = &DAT_aaaaaaaaaaaaaaaa;
  QFontMetrics::QFontMetrics(&fm,&this_00->data->fnt);
  QVar33.m_data = (storage_type *)0x1a;
  QVar33.m_size = (qsizetype)local_58;
  QString::fromLatin1(QVar33);
  local_a8.d.d = (Data *)local_58._0_8_;
  local_a8.d.ptr = (char16_t *)local_58._8_8_;
  local_a8.d.size = local_58._16_8_;
  iVar17 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_a8);
  QHeaderView::resizeSection((QHeaderView *)pQVar23,0,iVar17);
  if ((QSize)local_a8.d.d != (QSize)0x0) {
    LOCK();
    *(int *)local_a8.d.d = *(int *)local_a8.d.d + -1;
    UNLOCK();
    if (*(int *)local_a8.d.d == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar34.m_data = (storage_type *)0x9;
  QVar34.m_size = (qsizetype)local_58;
  QString::fromLatin1(QVar34);
  local_a8.d.d = (Data *)local_58._0_8_;
  local_a8.d.ptr = (char16_t *)local_58._8_8_;
  local_a8.d.size = local_58._16_8_;
  iVar17 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_a8);
  QHeaderView::resizeSection((QHeaderView *)pQVar23,1,iVar17);
  if ((QSize)local_a8.d.d != (QSize)0x0) {
    LOCK();
    *(int *)local_a8.d.d = *(int *)local_a8.d.d + -1;
    UNLOCK();
    if (*(int *)local_a8.d.d == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar35.m_data = (storage_type *)0x9;
  QVar35.m_size = (qsizetype)local_58;
  QString::fromLatin1(QVar35);
  local_a8.d.d = (Data *)local_58._0_8_;
  local_a8.d.ptr = (char16_t *)local_58._8_8_;
  local_a8.d.size = local_58._16_8_;
  iVar17 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_a8);
  QHeaderView::resizeSection((QHeaderView *)pQVar23,2,iVar17);
  if ((QSize)local_a8.d.d != (QSize)0x0) {
    LOCK();
    *(int *)local_a8.d.d = *(int *)local_a8.d.d + -1;
    UNLOCK();
    if (*(int *)local_a8.d.d == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QVar36.m_data = (storage_type *)0x10;
  QVar36.m_size = (qsizetype)local_58;
  QString::fromLatin1(QVar36);
  local_a8.d.d = (Data *)local_58._0_8_;
  local_a8.d.ptr = (char16_t *)local_58._8_8_;
  local_a8.d.size = local_58._16_8_;
  iVar17 = QFontMetrics::horizontalAdvance((QString *)&fm,(int)&local_a8);
  QHeaderView::resizeSection((QHeaderView *)pQVar23,3,iVar17);
  if ((QSize)local_a8.d.d != (QSize)0x0) {
    LOCK();
    *(int *)local_a8.d.d = *(int *)local_a8.d.d + -1;
    UNLOCK();
    if (*(int *)local_a8.d.d == 0) {
      QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
    }
  }
  QWidget::setContextMenuPolicy(pQVar23,ActionsContextMenu);
  this_03 = (QActionGroup *)operator_new(0x10);
  QActionGroup::QActionGroup(this_03,&this_00->super_QObject);
  QActionGroup::setExclusive(SUB81(this_03,0));
  local_58._0_8_ = QActionGroup::triggered;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)showHeader;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(QAction_*),_QtPrivate::List<QAction_*>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = showHeader;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_118,(void **)this_03,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_118);
  pQVar28 = this->proxyModel;
  if (pQVar28 == (QAbstractProxyModel *)0x0) {
    pQVar28 = (QAbstractProxyModel *)this->model;
  }
  local_58._0_8_ = -NAN;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  iVar17 = (**(code **)(*(long *)pQVar28 + 0x80))(pQVar28);
  if (1 < iVar17) {
    iVar17 = 1;
    do {
      this_04 = (QAction *)operator_new(0x10);
      QAction::QAction(this_04,(QObject *)this_03);
      QAction::setCheckable(SUB81(this_04,0));
      QAction::setChecked(SUB81(this_04,0));
      QWidget::addAction(pQVar23,this_04);
      iVar17 = iVar17 + 1;
      local_58._0_8_ = (PrivateShared *)0xffffffffffffffff;
      local_58._8_8_ = 0;
      local_58._16_8_ = 0;
      iVar18 = (**(code **)(*(long *)pQVar28 + 0x80))(pQVar28,local_58);
    } while (iVar17 < iVar18);
  }
  pQVar24 = QAbstractItemView::selectionModel
                      ((QAbstractItemView *)((this->qFileDialogUi).d)->treeView);
  pUVar27 = (this->qFileDialogUi).d;
  pQVar13 = pUVar27->treeView;
  pQVar25 = QAbstractItemView::selectionModel((QAbstractItemView *)pUVar27->listView);
  (**(code **)(*(long *)&(pQVar13->super_QTreeView).super_QAbstractItemView.
                         super_QAbstractScrollArea.super_QFrame.super_QWidget + 0x1d0))
            (pQVar13,pQVar25);
  pQVar13 = ((this->qFileDialogUi).d)->treeView;
  local_58._0_8_ = QAbstractItemView::activated;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)enterDirectory;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = enterDirectory;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_120,(void **)pQVar13,(QObject *)local_58,ppvVar6,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_120);
  pQVar13 = ((this->qFileDialogUi).d)->treeView;
  local_58._0_8_ = QWidget::customContextMenuRequested;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)showContextMenu;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QPoint_&),_QtPrivate::List<const_QPoint_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = showContextMenu;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_128,(void **)pQVar13,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_128);
  pQVar22 = (QShortcut *)operator_new(0x10);
  QShortcut::QShortcut
            (pQVar22,Delete,(QObject *)((this->qFileDialogUi).d)->treeView,(char *)0x0,(char *)0x0,
             WindowShortcut);
  local_58._0_8_ = QShortcut::activated;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)deleteCurrent;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QFileDialogPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar21 + 4) = deleteCurrent;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            ((QObject *)&local_130,(void **)pQVar22,(QObject *)local_58,ppvVar6,
             (QSlotObjectBase *)&local_a8,(ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection(&local_130);
  pQVar25 = QAbstractItemView::selectionModel
                      ((QAbstractItemView *)((this->qFileDialogUi).d)->listView);
  local_58._0_8_ = QItemSelectionModel::selectionChanged;
  local_58._8_8_ = 0;
  local_a8.d.d = (Data *)selectionChanged;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::QPrivateSlotObject<void_(QFileDialogPrivate::*)(),_QtPrivate::List<>,_void>::impl;
  *(code **)(puVar21 + 4) = selectionChanged;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_138,(void **)pQVar25,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_138);
  local_58._0_8_ = QItemSelectionModel::currentChanged;
  local_58._8_8_ = (char16_t *)0x0;
  local_a8.d.d = (Data *)currentChanged;
  local_a8.d.ptr = (char16_t *)0x0;
  ppvVar6 = *(void ***)&(this->super_QDialogPrivate).super_QWidgetPrivate.field_0x8;
  puVar21 = (undefined4 *)operator_new(0x20);
  *puVar21 = 1;
  *(code **)(puVar21 + 2) =
       QtPrivate::
       QPrivateSlotObject<void_(QFileDialogPrivate::*)(const_QModelIndex_&),_QtPrivate::List<const_QModelIndex_&>,_void>
       ::impl;
  *(code **)(puVar21 + 4) = currentChanged;
  *(undefined8 *)(puVar21 + 6) = 0;
  QObject::connectImpl
            (local_140,(void **)pQVar25,(QObject *)local_58,ppvVar6,(QSlotObjectBase *)&local_a8,
             (ConnectionType)puVar21,(int *)0x0,(QMetaObject *)0x0);
  QMetaObject::Connection::~Connection((Connection *)local_140);
  this_01 = ((this->qFileDialogUi).d)->splitter;
  pQVar23 = QSplitter::widget(this_01,1);
  iVar17 = QSplitter::indexOf(this_01,pQVar23);
  QSplitter::setStretchFactor(this_01,iVar17,7);
  createToolButtons(this);
  createMenuActions(this);
  bVar15 = restoreFromSettings(this);
  if (!bVar15) {
    local_158.d = (QUrlPrivate *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_150 = &DAT_aaaaaaaaaaaaaaaa;
    local_58._0_8_ = (QArrayData *)0x0;
    local_58._8_8_ = L"QtProject";
    local_58._16_8_ = 9;
    local_a8.d.size = 0;
    local_a8.d.d = (Data *)0x0;
    local_a8.d.ptr = (char16_t *)0x0;
    QSettings::QSettings
              ((QSettings *)&local_158,UserScope,(QString *)local_58,(QString *)&local_a8,
               (QObject *)0x0);
    if ((QSize)local_a8.d.d != (QSize)0x0) {
      LOCK();
      *(int *)local_a8.d.d = *(int *)local_a8.d.d + -1;
      UNLOCK();
      if (*(int *)local_a8.d.d == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
    if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
      LOCK();
      *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
      UNLOCK();
      if (*(int *)local_58._0_8_ == 0) {
        QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
      }
    }
    QVar37.m_size = (size_t)&local_158;
    QVar37.field_0.m_data = local_58;
    QSettings::value(QVar37);
    ::QVariant::toByteArray();
    QFileDialog::restoreState((QFileDialog *)this_00,(QByteArray *)&local_a8);
    if ((QSize)local_a8.d.d != (QSize)0x0) {
      LOCK();
      *(int *)local_a8.d.d = *(int *)local_a8.d.d + -1;
      UNLOCK();
      if (*(int *)local_a8.d.d == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,1,0x10);
      }
    }
    ::QVariant::~QVariant((QVariant *)local_58);
    QSettings::~QSettings((QSettings *)&local_158);
  }
  mode = QFileDialogOptions::fileMode();
  QFileDialog::setFileMode((QFileDialog *)this_00,mode);
  mode_00 = QFileDialogOptions::acceptMode();
  QFileDialog::setAcceptMode((QFileDialog *)this_00,mode_00);
  mode_01 = QFileDialogOptions::viewMode();
  QFileDialog::setViewMode((QFileDialog *)this_00,mode_01);
  options.super_QFlagsStorageHelper<QFileDialog::Option,_4>.super_QFlagsStorage<QFileDialog::Option>
  .i = (QFlagsStorageHelper<QFileDialog::Option,_4>)QFileDialogOptions::options();
  QFileDialog::setOptions((QFileDialog *)this_00,options);
  QFileDialogOptions::sidebarUrls();
  uVar14 = local_58._16_8_;
  QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)local_58);
  if (uVar14 != 0) {
    QFileDialogOptions::sidebarUrls();
    if (*(char *)(*(long *)&this_00->field_0x8 + 0x2c8) == '\0') {
      QUrlModel::setUrls(*(QUrlModel **)
                          (*(long *)(*(long *)(*(long *)&this_00->field_0x8 + 0x370) + 0x58) + 0x28)
                         ,(QList<QUrl> *)local_58);
    }
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)local_58);
  }
  QFileDialogOptions::initialDirectory();
  QFileDialog::setDirectoryUrl((QFileDialog *)this_00,(QUrl *)local_58);
  QUrl::~QUrl((QUrl *)local_58);
  QFileDialogOptions::mimeTypeFilters();
  uVar14 = local_58._16_8_;
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
  if (uVar14 == 0) {
    QFileDialogOptions::nameFilters();
    uVar14 = local_58._16_8_;
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
    if (uVar14 != 0) {
      QFileDialogOptions::nameFilters();
      QFileDialog::setNameFilters((QFileDialog *)this_00,(QStringList *)local_58);
      goto LAB_004e1430;
    }
  }
  else {
    QFileDialogOptions::mimeTypeFilters();
    QFileDialog::setMimeTypeFilters((QFileDialog *)this_00,(QStringList *)local_58);
LAB_004e1430:
    QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
  }
  QFileDialogOptions::initiallySelectedNameFilter();
  QFileDialog::selectNameFilter((QFileDialog *)this_00,(QString *)local_58);
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  QFileDialogOptions::defaultSuffix();
  QFileDialogOptions::setDefaultSuffix(*(QString **)(*(long *)&this_00->field_0x8 + 0x3d0));
  if ((QArrayData *)local_58._0_8_ != (QArrayData *)0x0) {
    LOCK();
    *(int *)local_58._0_8_ = *(int *)local_58._0_8_ + -1;
    UNLOCK();
    if (*(int *)local_58._0_8_ == 0) {
      QArrayData::deallocate((QArrayData *)local_58._0_8_,2,0x10);
    }
  }
  QFileDialogOptions::history();
  lVar26 = *(long *)(*(long *)&this_00->field_0x8 + 0x370);
  if (lVar26 != 0 && *(char *)(*(long *)&this_00->field_0x8 + 0x2c8) == '\0') {
    QFileDialogComboBox::setHistory
              (*(QFileDialogComboBox **)(lVar26 + 0x18),(QStringList *)local_58);
  }
  QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_58);
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QFileDialogOptions::initiallySelectedFiles();
  if ((undefined1 *)local_58._16_8_ == (undefined1 *)0x1) {
    QUrl::fileName(&local_a8,local_58._8_8_,0x7f00000);
    QFileDialog::selectFile((QFileDialog *)this_00,&local_a8);
    if ((QSize)local_a8.d.d != (QSize)0x0) {
      LOCK();
      *(int *)local_a8.d.d = *(int *)local_a8.d.d + -1;
      UNLOCK();
      if (*(int *)local_a8.d.d == 0) {
        QArrayData::deallocate(&(local_a8.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if ((undefined1 *)local_58._16_8_ != (undefined1 *)0x0) {
    lVar26 = local_58._16_8_ << 3;
    url_00 = (QUrl *)local_58._8_8_;
    do {
      QFileDialog::selectUrl((QFileDialog *)this_00,url_00);
      url_00 = url_00 + 1;
      lVar26 = lVar26 + -8;
    } while (lVar26 != 0);
  }
  QLineEdit::selectAll(&((this->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  updateOkButton(this);
  retranslateStrings(this);
  if ((RVar29.m_i | RVar30.m_i) < 0) {
    local_a8.d.d = (Data *)(**(code **)(*(long *)this_00 + 0x70))(this_00);
  }
  else {
    local_a8.d.d._4_4_ = RVar30.m_i;
    local_a8.d.d._0_4_ = RVar29.m_i;
  }
  QWidget::resize(this_00,(QSize *)&local_a8);
  QWidget::setWindowState(this_00,newstate);
  QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)local_58);
  if (pQVar24 != (QItemSelectionModel *)0x0) {
    (**(code **)(*(long *)pQVar24 + 0x20))(pQVar24);
  }
  QFontMetrics::~QFontMetrics(&fm);
  QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)local_88);
LAB_004e1679:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QFileDialogPrivate::createWidgets()
{
    if (qFileDialogUi)
        return;
    Q_Q(QFileDialog);

    // This function is sometimes called late (e.g as a fallback from setVisible). In that case we
    // need to ensure that the following UI code (setupUI in particular) doesn't reset any explicitly
    // set window state or geometry.
    QSize preSize = q->testAttribute(Qt::WA_Resized) ? q->size() : QSize();
    Qt::WindowStates preState = q->windowState();

    model = new QFileSystemModel(q);
    model->setIconProvider(&defaultIconProvider);
    model->setFilter(options->filter());
    model->setObjectName("qt_filesystem_model"_L1);
    if (QPlatformFileDialogHelper *helper = platformFileDialogHelper())
        model->setNameFilterDisables(helper->defaultNameFilterDisables());
    else
        model->setNameFilterDisables(false);
    model->d_func()->disableRecursiveSort = true;
    QObjectPrivate::connect(model, &QFileSystemModel::fileRenamed,
                            this, &QFileDialogPrivate::fileRenamed);
    QObjectPrivate::connect(model, &QFileSystemModel::rootPathChanged,
                            this, &QFileDialogPrivate::pathChanged);
    QObjectPrivate::connect(model, &QFileSystemModel::rowsInserted,
                            this, &QFileDialogPrivate::rowsInserted);
    model->setReadOnly(false);

    qFileDialogUi.reset(new Ui_QFileDialog());
    qFileDialogUi->setupUi(q);

    QList<QUrl> initialBookmarks;
    initialBookmarks << QUrl("file:"_L1)
                     << QUrl::fromLocalFile(QDir::homePath());
    qFileDialogUi->sidebar->setModelAndUrls(model, initialBookmarks);
    QObjectPrivate::connect(qFileDialogUi->sidebar, &QSidebar::goToUrl,
                            this, &QFileDialogPrivate::goToUrl);

    QObject::connect(qFileDialogUi->buttonBox, &QDialogButtonBox::accepted,
                     q, &QFileDialog::accept);
    QObject::connect(qFileDialogUi->buttonBox, &QDialogButtonBox::rejected,
                     q, &QFileDialog::reject);

    qFileDialogUi->lookInCombo->setFileDialogPrivate(this);
    QObjectPrivate::connect(qFileDialogUi->lookInCombo, &QComboBox::textActivated,
                            this, &QFileDialogPrivate::goToDirectory);

    qFileDialogUi->lookInCombo->setInsertPolicy(QComboBox::NoInsert);
    qFileDialogUi->lookInCombo->setDuplicatesEnabled(false);

    // filename
    qFileDialogUi->fileNameEdit->setFileDialogPrivate(this);
#ifndef QT_NO_SHORTCUT
    qFileDialogUi->fileNameLabel->setBuddy(qFileDialogUi->fileNameEdit);
#endif
#if QT_CONFIG(fscompleter)
    completer = new QFSCompleter(model, q);
    qFileDialogUi->fileNameEdit->setCompleter(completer);
#endif // QT_CONFIG(fscompleter)

    qFileDialogUi->fileNameEdit->setInputMethodHints(Qt::ImhNoPredictiveText);

    QObjectPrivate::connect(qFileDialogUi->fileNameEdit, &QLineEdit::textChanged,
                            this, &QFileDialogPrivate::autoCompleteFileName);
    QObjectPrivate::connect(qFileDialogUi->fileNameEdit, &QLineEdit::textChanged,
                            this, &QFileDialogPrivate::updateOkButton);
    QObject::connect(qFileDialogUi->fileNameEdit, &QLineEdit::returnPressed,
                     q, &QFileDialog::accept);

    // filetype
    qFileDialogUi->fileTypeCombo->setDuplicatesEnabled(false);
    qFileDialogUi->fileTypeCombo->setSizeAdjustPolicy(QComboBox::AdjustToContentsOnFirstShow);
    qFileDialogUi->fileTypeCombo->setSizePolicy(QSizePolicy::Expanding, QSizePolicy::Fixed);
    QObjectPrivate::connect(qFileDialogUi->fileTypeCombo, &QComboBox::activated,
                            this, &QFileDialogPrivate::useNameFilter);
    QObject::connect(qFileDialogUi->fileTypeCombo, &QComboBox::textActivated,
                     q, &QFileDialog::filterSelected);

    qFileDialogUi->listView->setFileDialogPrivate(this);
    qFileDialogUi->listView->setModel(model);
    QObjectPrivate::connect(qFileDialogUi->listView, &QAbstractItemView::activated,
                            this, &QFileDialogPrivate::enterDirectory);
    QObjectPrivate::connect(qFileDialogUi->listView, &QAbstractItemView::customContextMenuRequested,
                            this, &QFileDialogPrivate::showContextMenu);
#ifndef QT_NO_SHORTCUT
    QShortcut *shortcut = new QShortcut(QKeySequence::Delete, qFileDialogUi->listView);
    QObjectPrivate::connect(shortcut, &QShortcut::activated,
                            this, &QFileDialogPrivate::deleteCurrent);
#endif

    qFileDialogUi->treeView->setFileDialogPrivate(this);
    qFileDialogUi->treeView->setModel(model);
    QHeaderView *treeHeader = qFileDialogUi->treeView->header();
    QFontMetrics fm(q->font());
    treeHeader->resizeSection(0, fm.horizontalAdvance("wwwwwwwwwwwwwwwwwwwwwwwwww"_L1));
    treeHeader->resizeSection(1, fm.horizontalAdvance("128.88 GB"_L1));
    treeHeader->resizeSection(2, fm.horizontalAdvance("mp3Folder"_L1));
    treeHeader->resizeSection(3, fm.horizontalAdvance("10/29/81 02:02PM"_L1));
    treeHeader->setContextMenuPolicy(Qt::ActionsContextMenu);

    QActionGroup *showActionGroup = new QActionGroup(q);
    showActionGroup->setExclusive(false);
    QObjectPrivate::connect(showActionGroup, &QActionGroup::triggered,
                            this, &QFileDialogPrivate::showHeader);

    QAbstractItemModel *abstractModel = model;
#if QT_CONFIG(proxymodel)
    if (proxyModel)
        abstractModel = proxyModel;
#endif
    for (int i = 1; i < abstractModel->columnCount(QModelIndex()); ++i) {
        QAction *showHeader = new QAction(showActionGroup);
        showHeader->setCheckable(true);
        showHeader->setChecked(true);
        treeHeader->addAction(showHeader);
    }

    QScopedPointer<QItemSelectionModel> selModel(qFileDialogUi->treeView->selectionModel());
    qFileDialogUi->treeView->setSelectionModel(qFileDialogUi->listView->selectionModel());

    QObjectPrivate::connect(qFileDialogUi->treeView, &QAbstractItemView::activated,
                            this, &QFileDialogPrivate::enterDirectory);
    QObjectPrivate::connect(qFileDialogUi->treeView, &QAbstractItemView::customContextMenuRequested,
                            this, &QFileDialogPrivate::showContextMenu);
#ifndef QT_NO_SHORTCUT
    shortcut = new QShortcut(QKeySequence::Delete, qFileDialogUi->treeView);
    QObjectPrivate::connect(shortcut, &QShortcut::activated,
                            this, &QFileDialogPrivate::deleteCurrent);
#endif

    // Selections
    QItemSelectionModel *selections = qFileDialogUi->listView->selectionModel();
    QObjectPrivate::connect(selections, &QItemSelectionModel::selectionChanged,
                            this, &QFileDialogPrivate::selectionChanged);
    QObjectPrivate::connect(selections, &QItemSelectionModel::currentChanged,
                            this, &QFileDialogPrivate::currentChanged);
    qFileDialogUi->splitter->setStretchFactor(qFileDialogUi->splitter->indexOf(qFileDialogUi->splitter->widget(1)), QSizePolicy::Expanding);

    createToolButtons();
    createMenuActions();

#if QT_CONFIG(settings)
    // Try to restore from the FileDialog settings group; if it fails, fall back
    // to the pre-5.5 QByteArray serialized settings.
    if (!restoreFromSettings()) {
        const QSettings settings(QSettings::UserScope, u"QtProject"_s);
        q->restoreState(settings.value("Qt/filedialog").toByteArray());
    }
#endif

    // Initial widget states from options
    q->setFileMode(static_cast<QFileDialog::FileMode>(options->fileMode()));
    q->setAcceptMode(static_cast<QFileDialog::AcceptMode>(options->acceptMode()));
    q->setViewMode(static_cast<QFileDialog::ViewMode>(options->viewMode()));
    q->setOptions(static_cast<QFileDialog::Options>(static_cast<int>(options->options())));
    if (!options->sidebarUrls().isEmpty())
        q->setSidebarUrls(options->sidebarUrls());
    q->setDirectoryUrl(options->initialDirectory());
#if QT_CONFIG(mimetype)
    if (!options->mimeTypeFilters().isEmpty())
        q->setMimeTypeFilters(options->mimeTypeFilters());
    else
#endif
    if (!options->nameFilters().isEmpty())
        q->setNameFilters(options->nameFilters());
    q->selectNameFilter(options->initiallySelectedNameFilter());
    q->setDefaultSuffix(options->defaultSuffix());
    q->setHistory(options->history());
    const auto initiallySelectedFiles = options->initiallySelectedFiles();
    if (initiallySelectedFiles.size() == 1)
        q->selectFile(initiallySelectedFiles.first().fileName());
    for (const QUrl &url : initiallySelectedFiles)
        q->selectUrl(url);
    lineEdit()->selectAll();
    updateOkButton();
    retranslateStrings();
    q->resize(preSize.isValid() ? preSize : q->sizeHint());
    q->setWindowState(preState);
}